

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0> *
__thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_dwo_name_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *__return_storage_ptr__,dwarf_resolver *this,die_object *cu_die)

{
  undefined8 *puVar1;
  anon_union_32_2_d41c7fdf_for_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>_2
  local_68;
  bool local_48;
  anon_union_32_2_d41c7fdf_for_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>_2
  local_40;
  bool local_20;
  
  die_object::get_string_attribute_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              *)&local_68,cu_die,0x2130);
  if (local_48 == true) {
    __return_storage_ptr__->holds_value = true;
    puVar1 = (undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10);
    *(undefined8 **)&__return_storage_ptr__->field_0 = puVar1;
    if (local_68.uvalue._M_dataplus._M_p == (_Alloc_hider)((long)&local_68.uvalue + 0x10)) {
      *puVar1 = CONCAT71(local_68._17_7_,local_68._16_1_);
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x18) = local_68._24_8_;
    }
    else {
      (__return_storage_ptr__->field_0).uvalue._M_dataplus._M_p =
           (pointer)local_68.uvalue._M_dataplus._M_p;
      *(ulong *)((long)&__return_storage_ptr__->field_0 + 0x10) =
           CONCAT71(local_68._17_7_,local_68._16_1_);
    }
    (__return_storage_ptr__->field_0).uvalue._M_string_length = local_68.uvalue._M_string_length;
    local_68.uvalue._M_string_length = 0;
    local_68._16_1_ = 0;
    local_68.uvalue._M_dataplus._M_p = (_Alloc_hider)((long)&local_68.uvalue + 0x10);
  }
  else {
    die_object::get_string_attribute_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                *)&local_40,cu_die,0x76);
    if (local_20 == true) {
      __return_storage_ptr__->holds_value = true;
      puVar1 = (undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10);
      *(undefined8 **)&__return_storage_ptr__->field_0 = puVar1;
      if (local_40.uvalue._M_dataplus._M_p == (_Alloc_hider)((long)&local_40.uvalue + 0x10)) {
        *puVar1 = local_40._16_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x18) = local_40._24_8_;
      }
      else {
        (__return_storage_ptr__->field_0).uvalue._M_dataplus._M_p =
             (pointer)local_40.uvalue._M_dataplus._M_p;
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_40._16_8_;
      }
      (__return_storage_ptr__->field_0).uvalue._M_string_length = local_40.uvalue._M_string_length;
    }
    else {
      __return_storage_ptr__->holds_value = false;
    }
  }
  if (((local_48 & 1U) != 0) &&
     (local_68.uvalue._M_dataplus._M_p != (_Alloc_hider)((long)&local_68.uvalue + 0x10))) {
    operator_delete((void *)local_68.uvalue._M_dataplus._M_p,
                    CONCAT71(local_68._17_7_,local_68._16_1_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> get_dwo_name(const die_object& cu_die) {
            if(auto dwo_name = cu_die.get_string_attribute(DW_AT_GNU_dwo_name)) {
                return dwo_name;
            } else if(auto dwo_name = cu_die.get_string_attribute(DW_AT_dwo_name)) {
                return dwo_name;
            } else {
                return nullopt;
            }
        }